

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

TestPreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          *presets,WorkflowStep *step)

{
  const_iterator cVar1;
  string *psVar2;
  char *pcVar3;
  size_t sVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string local_128;
  string local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d0;
  size_t local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  size_type local_88;
  pointer local_80;
  undefined8 local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  pcVar3 = type.super_string_view._M_str;
  sVar4 = type.super_string_view._M_len;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          ::find(&presets->_M_t,&step->PresetName);
  local_b8 = sVar4;
  local_b0 = pcVar3;
  if ((_Rb_tree_header *)cVar1._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header) {
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_d0.first._M_len = 8;
    local_d0.first._M_str = "No such ";
    local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = 0;
    local_a0 = 0xb;
    local_98 = " preset in ";
    local_90 = 0;
    local_80 = (psVar2->_M_dataplus)._M_p;
    local_88 = psVar2->_M_string_length;
    local_78 = 0;
    local_70 = 3;
    local_68 = ": \"";
    local_60 = 0;
    local_50 = (step->PresetName)._M_dataplus._M_p;
    local_58 = (step->PresetName)._M_string_length;
    local_48 = 0;
    local_108.field_2._M_allocated_capacity = (long)&local_108.field_2 + 8;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 1;
    local_108.field_2._M_local_buf[8] = '\"';
    local_40 = 1;
    local_30 = 0;
    views_00._M_len = 7;
    views_00._M_array = &local_d0;
    local_38 = (undefined1 *)local_108.field_2._M_allocated_capacity;
    cmCatViews(&local_128,views_00);
    cmSystemTools::Error(&local_128);
  }
  else if ((char)cVar1._M_node[4]._M_color == _S_black) {
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_d0.first._M_len = 0x12;
    local_d0.first._M_str = "Cannot use hidden ";
    local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = 0;
    local_a0 = 0xb;
    local_98 = " preset in ";
    local_90 = 0;
    local_80 = (psVar2->_M_dataplus)._M_p;
    local_88 = psVar2->_M_string_length;
    local_78 = 0;
    local_70 = 3;
    local_68 = ": \"";
    local_60 = 0;
    local_50 = (step->PresetName)._M_dataplus._M_p;
    local_58 = (step->PresetName)._M_string_length;
    local_48 = 0;
    local_108.field_2._M_allocated_capacity = (long)&local_108.field_2 + 8;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 1;
    local_108.field_2._M_local_buf[8] = '\"';
    local_40 = 1;
    local_30 = 0;
    views._M_len = 7;
    views._M_array = &local_d0;
    local_38 = (undefined1 *)local_108.field_2._M_allocated_capacity;
    cmCatViews(&local_128,views);
    cmSystemTools::Error(&local_128);
  }
  else {
    if (*(char *)&cVar1._M_node[0x3a]._M_left == '\0') {
      local_d0.first._M_len = 0x13;
      local_d0.first._M_str = "Could not evaluate ";
      local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_a8 = 0;
      local_a0 = 9;
      local_98 = " preset \"";
      local_90 = 0;
      local_80 = (step->PresetName)._M_dataplus._M_p;
      local_88 = (step->PresetName)._M_string_length;
      local_78 = 0;
      local_70 = 0x1a;
      local_68 = "\": Invalid macro expansion";
      local_60 = 0;
      views_01._M_len = 5;
      views_01._M_array = &local_d0;
      cmCatViews(&local_108,views_01);
      cmSystemTools::Error(&local_108);
      local_128.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_128._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return (TestPreset *)0x0;
      }
      goto LAB_004045ef;
    }
    if (*(char *)&cVar1._M_node[0x23]._M_parent != '\0') {
      return (TestPreset *)&cVar1._M_node[0x1e]._M_parent;
    }
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_d0.first._M_len = 0x14;
    local_d0.first._M_str = "Cannot use disabled ";
    local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = 0;
    local_a0 = 0xb;
    local_98 = " preset in ";
    local_90 = 0;
    local_80 = (psVar2->_M_dataplus)._M_p;
    local_88 = psVar2->_M_string_length;
    local_78 = 0;
    local_70 = 3;
    local_68 = ": \"";
    local_60 = 0;
    local_50 = (step->PresetName)._M_dataplus._M_p;
    local_58 = (step->PresetName)._M_string_length;
    local_48 = 0;
    local_108.field_2._M_allocated_capacity = (long)&local_108.field_2 + 8;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 1;
    local_108.field_2._M_local_buf[8] = '\"';
    local_40 = 1;
    local_30 = 0;
    views_02._M_len = 7;
    views_02._M_array = &local_d0;
    local_38 = (undefined1 *)local_108.field_2._M_allocated_capacity;
    cmCatViews(&local_128,views_02);
    cmSystemTools::Error(&local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == &local_128.field_2) {
    return (TestPreset *)0x0;
  }
LAB_004045ef:
  operator_delete(local_128._M_dataplus._M_p,(ulong)(local_128.field_2._M_allocated_capacity + 1));
  return (TestPreset *)0x0;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}